

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O3

void __thiscall BinarySearchTree::caseC(BinarySearchTree *this,Node *par,Node *loc)

{
  Node *pNVar1;
  Node *ptrSave;
  Node *pNVar2;
  Node *pNVar3;
  
  pNVar1 = loc->rightChild;
  pNVar2 = loc;
  do {
    pNVar3 = pNVar2;
    pNVar2 = pNVar1;
    pNVar1 = pNVar2->leftChild;
  } while (pNVar2->leftChild != (Node *)0x0);
  (&pNVar3->leftChild)[pNVar3->leftChild != pNVar2] = pNVar2->rightChild;
  if (par != (Node *)0x0) {
    this = (BinarySearchTree *)&par->rightChild;
    if (par->leftChild == loc) {
      this = (BinarySearchTree *)&par->leftChild;
    }
  }
  *this = (BinarySearchTree)pNVar2;
  pNVar1 = loc->rightChild;
  pNVar2->leftChild = loc->leftChild;
  pNVar2->rightChild = pNVar1;
  return;
}

Assistant:

void BinarySearchTree::caseC(Node *par, Node *loc) {
    Node *ptr, *ptrSave, *suc, *parSuc;
    ptrSave = loc;
    ptr = loc->rightChild;
    while (ptr->leftChild != nullptr) {
        ptrSave = ptr;
        ptr = ptr->leftChild;
    }
    suc = ptr;
    parSuc = ptrSave;
    if (suc->leftChild == nullptr && suc->rightChild == nullptr) {
        caseA(parSuc, suc);
    } else {
        caseB(parSuc, suc);
    }
    if (par == nullptr) {
        root = suc;
    } else {
        if (loc == par->leftChild) {
            par->leftChild = suc;
        } else {
            par->rightChild = suc;
        }
    }
    suc->leftChild = loc->leftChild;
    suc->rightChild = loc->rightChild;
}